

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grisu.h
# Opt level: O0

void floaxie::digit_gen_select<false>::gen<float,char>
               (diy_fp<float,_floaxie::diy_fp_traits<float>_> *Mp,
               diy_fp<float,_floaxie::diy_fp_traits<float>_> *Mm,char *buffer,int *len,int *K)

{
  int iVar1;
  int iVar2;
  char cVar3;
  exponent_storage_type eVar4;
  uint uVar5;
  mantissa_storage_type mVar6;
  mantissa_storage_type mVar7;
  byte local_7a;
  uchar d;
  uchar kappa;
  bool some_already_written;
  half_of_mantissa_storage_type *div;
  uchar *kappa_1;
  uchar **local_60;
  kappa_pair_type *kappa_div;
  uint uStack_50;
  bool close_to_delta;
  mantissa_storage_type delta_f;
  mantissa_storage_type p2;
  half_of_mantissa_storage_type p1;
  diy_fp<float,_floaxie::diy_fp_traits<float>_> one;
  diy_fp<float,_floaxie::diy_fp_traits<float>_> *delta;
  int *K_local;
  int *len_local;
  char *buffer_local;
  diy_fp<float,_floaxie::diy_fp_traits<float>_> *Mm_local;
  diy_fp<float,_floaxie::diy_fp_traits<float>_> *Mp_local;
  
  eVar4 = diy_fp<float,_floaxie::diy_fp_traits<float>_>::exponent(Mp);
  if (0 < eVar4) {
    __assert_fail("Mp.exponent() <= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/floaxie/floaxie/grisu.h"
                  ,0x7e,
                  "static void floaxie::digit_gen_select<false>::gen(const diy_fp<FloatType> &, const diy_fp<FloatType> &, CharType *, int *, int *) [FloatType = float, CharType = char]"
                 );
  }
  one = diy_fp<float,_floaxie::diy_fp_traits<float>_>::operator-(Mp,Mm);
  eVar4 = diy_fp<float,_floaxie::diy_fp_traits<float>_>::exponent(Mp);
  uVar5 = raised_bit<unsigned_int>((long)-eVar4);
  eVar4 = diy_fp<float,_floaxie::diy_fp_traits<float>_>::exponent(Mp);
  diy_fp<float,_floaxie::diy_fp_traits<float>_>::diy_fp
            ((diy_fp<float,_floaxie::diy_fp_traits<float>_> *)&p2,uVar5,eVar4);
  mVar6 = diy_fp<float,_floaxie::diy_fp_traits<float>_>::mantissa(Mp);
  eVar4 = diy_fp<float,_floaxie::diy_fp_traits<float>_>::exponent
                    ((diy_fp<float,_floaxie::diy_fp_traits<float>_> *)&p2);
  delta_f = mVar6 >> (-(char)eVar4 & 0x1fU);
  mVar6 = diy_fp<float,_floaxie::diy_fp_traits<float>_>::mantissa(Mp);
  mVar7 = diy_fp<float,_floaxie::diy_fp_traits<float>_>::mantissa
                    ((diy_fp<float,_floaxie::diy_fp_traits<float>_> *)&p2);
  uStack_50 = mVar6 & mVar7 - 1;
  if (delta_f != 0 || uStack_50 != 0) {
    *len = 0;
    kappa_div._4_4_ = diy_fp<float,_floaxie::diy_fp_traits<float>_>::mantissa(&one);
    kappa_div._3_1_ = uStack_50 <= kappa_div._4_4_;
    if (delta_f != 0) {
      kappa_1 = (uchar *)calculate_kappa_div(delta_f);
      local_60 = &kappa_1;
      while ((byte)kappa_1 != 0 && delta_f != 0) {
        iVar1 = *len;
        *len = iVar1 + 1;
        buffer[iVar1] = (char)(delta_f / kappa_1._4_4_) + '0';
        delta_f = delta_f % kappa_1._4_4_;
        kappa_1._0_1_ = (byte)kappa_1 - 1;
      }
      if ((kappa_div._3_1_ & 1) != 0) {
        *K = (uint)(byte)kappa_1 + *K;
        return;
      }
      wrap::memset<char>(buffer + *len,'0',(ulong)kappa_1 & 0xff);
      *len = (uint)(byte)kappa_1 + *len;
    }
    iVar1 = *len;
    local_7a = 0;
    for (; kappa_div._4_4_ < uStack_50; kappa_div._4_4_ = kappa_div._4_4_ * 10) {
      uVar5 = uStack_50 * 10;
      uStack_50 = uVar5;
      eVar4 = diy_fp<float,_floaxie::diy_fp_traits<float>_>::exponent
                        ((diy_fp<float,_floaxie::diy_fp_traits<float>_> *)&p2);
      cVar3 = (char)(uVar5 >> (-(char)eVar4 & 0x1fU));
      if ((0 < iVar1) || (cVar3 != '\0')) {
        iVar2 = *len;
        *len = iVar2 + 1;
        buffer[iVar2] = cVar3 + '0';
      }
      mVar6 = diy_fp<float,_floaxie::diy_fp_traits<float>_>::mantissa
                        ((diy_fp<float,_floaxie::diy_fp_traits<float>_> *)&p2);
      uStack_50 = mVar6 - 1 & uStack_50;
      local_7a = local_7a + 1;
    }
    *K = *K - (uint)local_7a;
    return;
  }
  __assert_fail("p1 || p2",
                "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/floaxie/floaxie/grisu.h"
                ,0x87,
                "static void floaxie::digit_gen_select<false>::gen(const diy_fp<FloatType> &, const diy_fp<FloatType> &, CharType *, int *, int *) [FloatType = float, CharType = char]"
               );
}

Assistant:

inline static void gen(const diy_fp<FloatType>& Mp, const diy_fp<FloatType>& Mm, CharType* buffer, int* len, int* K) noexcept
		{
			assert(Mp.exponent() <= 0);

			const diy_fp<FloatType>& delta(Mp - Mm);

			const diy_fp<FloatType> one(raised_bit<typename diy_fp<FloatType>::mantissa_storage_type>(-Mp.exponent()), Mp.exponent());

			half_of_mantissa_storage_type p1 = Mp.mantissa() >> -one.exponent();
			typename diy_fp<FloatType>::mantissa_storage_type p2 = Mp.mantissa() & (one.mantissa() - 1);

			assert(p1 || p2);

			*len = 0;

			auto delta_f = delta.mantissa();

			const bool close_to_delta = p2 <= delta_f;

			if (p1)
			{
				auto&& kappa_div(calculate_kappa_div(p1));

				unsigned char& kappa(kappa_div.first);
				half_of_mantissa_storage_type& div(kappa_div.second);

				while (kappa > 0 && p1)
				{
					buffer[(*len)++] = '0' + p1 / div;

					p1 %= div;

					kappa--;
					div /= 10;
				}

				if (close_to_delta)
				{
					*K += kappa;
					return;
				}
				else
				{
					wrap::memset(buffer + (*len), CharType('0'), kappa);
					(*len) += kappa;
				}
			}

			const bool some_already_written = (*len) > 0;
			unsigned char kappa(0);

			while (p2 > delta_f)
			{
				p2 *= 10;

				const unsigned char d = p2 >> -one.exponent();

				if (some_already_written || d)
					buffer[(*len)++] = '0' + d;

				p2 &= one.mantissa() - 1;

				++kappa;
				delta_f *= 10;
			}

			*K -= kappa;
		}